

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant.cpp
# Opt level: O2

UMatchDegree __thiscall
icu_63::Quantifier::matches
          (Quantifier *this,Replaceable *text,int32_t *offset,int32_t limit,UBool incremental)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  uint uVar3;
  int32_t pos;
  int32_t iVar4;
  UMatchDegree UVar5;
  
  iVar1 = *offset;
  uVar3 = 0;
  UVar5 = U_PARTIAL_MATCH;
  iVar2 = iVar1;
  do {
    iVar4 = iVar2;
    if (this->maxCount <= uVar3) break;
    iVar2 = (*(this->matcher->super_UObject)._vptr_UObject[4])();
    iVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))
                      ((long *)CONCAT44(extraout_var,iVar2),text,offset,limit,(int)incremental);
    if (iVar2 != 2) {
      if ((incremental != '\0') && (iVar2 == 1)) {
        return U_PARTIAL_MATCH;
      }
      iVar4 = *offset;
      break;
    }
    uVar3 = uVar3 + 1;
    iVar2 = *offset;
  } while (iVar4 != *offset);
  if ((incremental == '\0') || (iVar4 != limit)) {
    if (uVar3 < this->minCount) {
      *offset = iVar1;
      UVar5 = U_MISMATCH;
    }
    else {
      UVar5 = U_MATCH;
    }
  }
  return UVar5;
}

Assistant:

UMatchDegree Quantifier::matches(const Replaceable& text,
                                 int32_t& offset,
                                 int32_t limit,
                                 UBool incremental) {
    int32_t start = offset;
    uint32_t count = 0;
    while (count < maxCount) {
        int32_t pos = offset;
        UMatchDegree m = matcher->toMatcher()->matches(text, offset, limit, incremental);
        if (m == U_MATCH) {
            ++count;
            if (pos == offset) {
                // If offset has not moved we have a zero-width match.
                // Don't keep matching it infinitely.
                break;
            }
        } else if (incremental && m == U_PARTIAL_MATCH) {
            return U_PARTIAL_MATCH;
        } else {
            break;
        }
    }
    if (incremental && offset == limit) {
        return U_PARTIAL_MATCH;
    }
    if (count >= minCount) {
        return U_MATCH;
    }
    offset = start;
    return U_MISMATCH;
}